

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qshareddata.h
# Opt level: O0

void __thiscall
QSharedDataPointer<QPropertyBindingErrorPrivate>::detach_helper
          (QSharedDataPointer<QPropertyBindingErrorPrivate> *this)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  QPropertyBindingErrorPrivate *pQVar3;
  int in_ECX;
  void *in_RDX;
  __fn *in_RSI;
  QSharedDataPointer<QPropertyBindingErrorPrivate> *in_RDI;
  void *in_R8;
  QPropertyBindingErrorPrivate *x;
  QBasicAtomicInteger<int> *in_stack_ffffffffffffffe0;
  
  iVar2 = clone(in_RDI,in_RSI,in_RDX,in_ECX,in_R8);
  QBasicAtomicInteger<int>::ref(in_stack_ffffffffffffffe0);
  Qt::totally_ordered_wrapper<QPropertyBindingErrorPrivate_*>::get(&in_RDI->d);
  bVar1 = QBasicAtomicInteger<int>::deref((QBasicAtomicInteger<int> *)0x41c16d);
  if ((!bVar1) &&
     (pQVar3 = Qt::totally_ordered_wrapper<QPropertyBindingErrorPrivate_*>::get(&in_RDI->d),
     pQVar3 != (QPropertyBindingErrorPrivate *)0x0)) {
    QPropertyBindingErrorPrivate::~QPropertyBindingErrorPrivate
              ((QPropertyBindingErrorPrivate *)0x41c190);
    operator_delete(pQVar3,0x20);
  }
  Qt::totally_ordered_wrapper<QPropertyBindingErrorPrivate_*>::reset
            (&in_RDI->d,(QPropertyBindingErrorPrivate *)CONCAT44(extraout_var,iVar2));
  return;
}

Assistant:

Q_OUTOFLINE_TEMPLATE void QSharedDataPointer<T>::detach_helper()
{
    T *x = clone();
    x->ref.ref();
    if (!d.get()->ref.deref())
        delete d.get();
    d.reset(x);
}